

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O3

void __thiscall
spvtools::opt::anon_unknown_8::ComputeRegisterLiveness::DoLoopLivenessUnification
          (ComputeRegisterLiveness *this,Loop *loop)

{
  pointer ppLVar1;
  Loop *loop_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __first_02;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_01;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
  __last_02;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> _Var2;
  _Node_iterator<spvtools::opt::Instruction_*,_true,_false> _Var3;
  bool bVar4;
  RegionRegisterLiveness *pRVar5;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Var6;
  BasicBlock *in_R9;
  pointer ppLVar7;
  anon_class_16_2_3f78c113_for_predicate_ predicate;
  anon_class_16_2_3f78c113_for_predicate_ predicate_00;
  ExcludePhiDefinedInBlock predicate_01;
  Range live_loop;
  FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
  __begin3;
  Range local_b8;
  FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
  local_78;
  FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
  local_50;
  
  predicate.this = (ComputeRegisterLiveness *)in_R9;
  predicate.loop = (Loop *)this;
  MakeFilterIterator<std::__detail::_Node_const_iterator<unsigned_int,true,false>,spvtools::opt::(anonymous_namespace)::ComputeRegisterLiveness::DoLoopLivenessUnification(spvtools::opt::Loop_const&)::_lambda(unsigned_int)_1_>
            (&local_50,(opt *)(loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<unsigned_int,_true,_false> *)0x0,
             (_Node_const_iterator<unsigned_int,_true,_false> *)loop,predicate);
  predicate_00.this = (ComputeRegisterLiveness *)in_R9;
  predicate_00.loop = (Loop *)this;
  MakeFilterIterator<std::__detail::_Node_const_iterator<unsigned_int,true,false>,spvtools::opt::(anonymous_namespace)::ComputeRegisterLiveness::DoLoopLivenessUnification(spvtools::opt::Loop_const&)::_lambda(unsigned_int)_1_>
            ((FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ValveSoftware[P]Fossilize_cli_SPIRV_Tools_source_opt_register_pressure_cpp:175:9)>
              *)&local_b8,(opt *)0x0,(_Node_const_iterator<unsigned_int,_true,_false> *)0x0,
             (_Node_const_iterator<unsigned_int,_true,_false> *)loop,predicate_00);
  _Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_b8.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  _Var2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)local_b8.begin_.cur_;
  pRVar5 = RegisterLiveness::Get(this->reg_pressure_,loop->loop_header_);
  if (pRVar5 == (RegionRegisterLiveness *)0x0) {
    __assert_fail("header_live_inout && \"Liveness analysis was not performed for the current block\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp"
                  ,0xb7,
                  "void spvtools::opt::(anonymous namespace)::ComputeRegisterLiveness::DoLoopLivenessUnification(const Loop &)"
                 );
  }
  local_78.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur =
       (_Node_iterator_base<unsigned_int,_false>)(__node_type *)0x0;
  predicate_01.bb_ = in_R9;
  predicate_01.context_ = (IRContext *)loop->loop_header_;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
            (&local_b8,(opt *)(pRVar5->live_in_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_78,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)this->context_,
             predicate_01);
  local_78.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur =
       local_50.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur;
  local_78.end_.super__Node_iterator_base<unsigned_int,_false>._M_cur =
       local_50.end_.super__Node_iterator_base<unsigned_int,_false>._M_cur;
  local_78.predicate_.loop = local_50.predicate_.loop;
  local_78.predicate_.this = local_50.predicate_.this;
  if ((_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
      local_50.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur !=
      _Var2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ||
      ((ulong)_Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ^
      (ulong)local_50.end_.super__Node_iterator_base<unsigned_int,_false>._M_cur) != 0) {
    _Var6 = local_50.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    do {
      bb = CFG::block(this->cfg_,
                      (uint32_t)
                      ((_Var6._M_cur)->super__Hash_node_value<unsigned_int,_false>).
                      super__Hash_node_value_base<unsigned_int>._M_storage._M_storage);
      pRVar5 = RegisterLiveness::Get(this->reg_pressure_,bb);
      __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
           _M_cur;
      __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
           _M_cur;
      __first.predicate_.context_ = local_b8.begin_.predicate_.context_;
      __first.predicate_.bb_ = local_b8.begin_.predicate_.bb_;
      __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last.predicate_.context_ = local_b8.end_.predicate_.context_;
      __last.predicate_.bb_ = local_b8.end_.predicate_.bb_;
      std::
      unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
      ::
      insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
                ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                  *)pRVar5,__first,__last);
      __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
           _M_cur;
      __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
           _M_cur;
      __first_00.predicate_.context_ = local_b8.begin_.predicate_.context_;
      __first_00.predicate_.bb_ = local_b8.begin_.predicate_.bb_;
      __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           local_b8.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      __last_00.predicate_.context_ = local_b8.end_.predicate_.context_;
      __last_00.predicate_.bb_ = local_b8.end_.predicate_.bb_;
      std::
      unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
      ::
      insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
                ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                  *)&pRVar5->live_out_,__first_00,__last_00);
      if ((_Node_iterator_base<unsigned_int,_false>)_Var6._M_cur !=
          local_50.end_.super__Node_iterator_base<unsigned_int,_false>._M_cur) {
        do {
          _Var6._M_cur = (__node_type *)
                         (((__node_type *)_Var6._M_cur)->super__Hash_node_base)._M_nxt;
          local_78.cur_.super__Node_iterator_base<unsigned_int,_false>._M_cur =
               (_Node_iterator_base<unsigned_int,_false>)
               (_Node_iterator_base<unsigned_int,_false>)_Var6._M_cur;
          bVar4 = FilterIterator<std::__detail::_Node_const_iterator<unsigned_int,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/register_pressure.cpp:175:9)>
                  ::IsPredicateSatisfied(&local_78);
        } while (!bVar4);
      }
    } while ((_Node_iterator_base<spvtools::opt::Instruction_*,_false>)_Var6._M_cur !=
             _Var2.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ||
             ((ulong)_Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ^
             (ulong)local_50.end_.super__Node_iterator_base<unsigned_int,_false>._M_cur) != 0);
  }
  ppLVar1 = (loop->nested_loops_).
            super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar7 = (loop->nested_loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppLVar7 != ppLVar1; ppLVar7 = ppLVar7 + 1
      ) {
    loop_00 = *ppLVar7;
    pRVar5 = RegisterLiveness::Get(this->reg_pressure_,loop_00->loop_header_);
    __first_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_01.predicate_.context_ = local_b8.begin_.predicate_.context_;
    __first_01.predicate_.bb_ = local_b8.begin_.predicate_.bb_;
    __last_01.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_01.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_01.predicate_.context_ = local_b8.end_.predicate_.context_;
    __last_01.predicate_.bb_ = local_b8.end_.predicate_.bb_;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)pRVar5,__first_01,__last_01);
    __first_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __first_02.predicate_.context_ = local_b8.begin_.predicate_.context_;
    __first_02.predicate_.bb_ = local_b8.begin_.predicate_.bb_;
    __last_02.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_02.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
         local_b8.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    __last_02.predicate_.context_ = local_b8.end_.predicate_.context_;
    __last_02.predicate_.bb_ = local_b8.end_.predicate_.bb_;
    std::
    unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
    ::
    insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>>
              ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
                *)&pRVar5->live_out_,__first_02,__last_02);
    DoLoopLivenessUnification(this,loop_00);
  }
  return;
}

Assistant:

void DoLoopLivenessUnification(const Loop& loop) {
    auto blocks_in_loop = MakeFilterIteratorRange(
        loop.GetBlocks().begin(), loop.GetBlocks().end(),
        [&loop, this](uint32_t bb_id) {
          return bb_id != loop.GetHeaderBlock()->id() &&
                 loop_desc_[bb_id] == &loop;
        });

    RegisterLiveness::RegionRegisterLiveness* header_live_inout =
        reg_pressure_->Get(loop.GetHeaderBlock());
    assert(header_live_inout &&
           "Liveness analysis was not performed for the current block");

    ExcludePhiDefinedInBlock predicate(context_, loop.GetHeaderBlock());
    auto live_loop =
        MakeFilterIteratorRange(header_live_inout->live_in_.begin(),
                                header_live_inout->live_in_.end(), predicate);

    for (uint32_t bb_id : blocks_in_loop) {
      BasicBlock* bb = cfg_.block(bb_id);

      RegisterLiveness::RegionRegisterLiveness* live_inout =
          reg_pressure_->Get(bb);
      live_inout->live_in_.insert(live_loop.begin(), live_loop.end());
      live_inout->live_out_.insert(live_loop.begin(), live_loop.end());
    }

    for (const Loop* inner_loop : loop) {
      RegisterLiveness::RegionRegisterLiveness* live_inout =
          reg_pressure_->Get(inner_loop->GetHeaderBlock());
      live_inout->live_in_.insert(live_loop.begin(), live_loop.end());
      live_inout->live_out_.insert(live_loop.begin(), live_loop.end());

      DoLoopLivenessUnification(*inner_loop);
    }
  }